

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<int>::ShaderBuiltinConstantCase
          (ShaderBuiltinConstantCase<int> *this,Context *context,char *varName,
          GetConstantValueFunc getValue,char *requiredExt)

{
  bool *__s;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,varName,&local_69);
  makeCaseName(&local_68,&local_48);
  gles31::TestCase::TestCase(&this->super_TestCase,context,local_68._M_dataplus._M_p,varName);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderBuiltinConstantCase_01e58f58;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_varName,varName,(allocator<char> *)&local_68);
  this->m_getValue = getValue;
  __s = glcts::fixed_sample_locations_values + 1;
  if (requiredExt != (char *)0x0) {
    __s = (bool *)requiredExt;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_requiredExt,__s,(allocator<char> *)&local_68);
  return;
}

Assistant:

ShaderBuiltinConstantCase<DataType>::ShaderBuiltinConstantCase (Context& context, const char* varName, GetConstantValueFunc getValue, const char* requiredExt)
	: TestCase		(context, makeCaseName(varName).c_str(), varName)
	, m_varName		(varName)
	, m_getValue	(getValue)
	, m_requiredExt	(requiredExt ? requiredExt : "")
{
	DE_ASSERT(!requiredExt == m_requiredExt.empty());
}